

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::PromiseResolver
          (PromiseResolver<std::vector<int,_std::allocator<int>_>_> *this,
          QPromise<std::vector<int,_std::allocator<int>_>_> *promise)

{
  Data *pDVar1;
  QPromise<std::vector<int,_std::allocator<int>_>_> *this_00;
  QPromise<std::vector<int,_std::allocator<int>_>_> *promise_local;
  PromiseResolver<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<std::vector<int,_std::allocator<int>_>_> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
  ::QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x10);
  QtPromise::QPromise<std::vector<int,_std::allocator<int>_>_>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
           ::operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }